

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O0

void __thiscall libtorrent::aux::socks5::hung_up(socks5 *this,error_code *e)

{
  bool bVar1;
  byte local_39;
  operation_t local_29;
  error_code local_28;
  error_code *local_18;
  error_code *e_local;
  socks5 *this_local;
  
  this->m_active = false;
  local_18 = e;
  e_local = (error_code *)this;
  boost::system::error_code::error_code<boost::asio::error::basic_errors>
            (&local_28,operation_aborted,(type *)0x0);
  bVar1 = boost::system::operator==(e,&local_28);
  local_39 = 1;
  if (!bVar1) {
    local_39 = this->m_abort;
  }
  if ((local_39 & 1) == 0) {
    bVar1 = boost::system::error_code::operator_cast_to_bool(local_18);
    if ((bVar1) &&
       (bVar1 = alert_manager::should_post<libtorrent::socks5_alert>(this->m_alerts), bVar1)) {
      local_29 = sock_read;
      alert_manager::
      emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,boost::system::error_code_const&>
                (this->m_alerts,&this->m_proxy_addr,&local_29,local_18);
    }
    retry_connection(this);
  }
  return;
}

Assistant:

void socks5::hung_up(error_code const& e)
{
	COMPLETE_ASYNC("socks5::hung_up");
	m_active = false;

	if (e == boost::asio::error::operation_aborted || m_abort) return;

	if (e && m_alerts.should_post<socks5_alert>())
		m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::sock_read, e);

	retry_connection();
}